

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O2

void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect)

{
  Rnm_Obj_t RVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *p_00;
  int iVar3;
  int iVar4;
  int iVar5;
  Rnm_Obj_t *pRVar6;
  Rnm_Obj_t *pRVar7;
  Gia_Obj_t *pObj_00;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  while( true ) {
    pRVar6 = Rnm_ManObj(p,pObj,f);
    if (((uint)*pRVar6 & 2) != 0) {
      __assert_fail("pRnm->fVisit == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                    ,0x1db,
                    "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)")
      ;
    }
    *pRVar6 = (Rnm_Obj_t)((uint)*pRVar6 | 2);
    pRVar7 = Rnm_ManObj(p,pObj,0);
    if (((uint)*pRVar7 & 4) == 0) {
      pRVar7 = Rnm_ManObj(p,pObj,0);
      *(byte *)pRVar7 = *(byte *)pRVar7 | 4;
      p->nVisited = p->nVisited + 1;
    }
    if (((uint)*pRVar6 & 8) != 0) {
      if (((uint)*pRVar6 & 0xffffff0) == 0) {
        __assert_fail("(int)pRnm->Prio > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x1e4,
                      "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                     );
      }
      for (iVar3 = p->pCex->iFrame; -1 < iVar3; iVar3 = iVar3 + -1) {
        pRVar6 = Rnm_ManObj(p,pObj,iVar3);
        if (((uint)*pRVar6 & 2) == 0) {
          Rnm_ManJustifyPropFanout_rec(p,pObj,iVar3,vSelect);
        }
      }
      iVar3 = Gia_ObjId(p->pGia,pObj);
      Vec_IntPush(vSelect,iVar3);
      return;
    }
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && (int)*(uint *)pObj < 0) {
      if (f == p->pCex->iFrame) {
        return;
      }
      pGVar2 = p->pGia;
      iVar3 = Gia_ObjCioId(pObj);
      if (iVar3 < pGVar2->vCos->nSize - pGVar2->nRegs) {
        return;
      }
    }
    iVar3 = Gia_ObjIsRi(p->pGia,pObj);
    pGVar2 = p->pGia;
    if (iVar3 == 0) break;
    iVar3 = Gia_ObjIsRi(pGVar2,pObj);
    if (iVar3 == 0) {
      __assert_fail("Gia_ObjIsRi(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1d0,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar3 = pGVar2->vCis->nSize;
    iVar5 = pGVar2->vCos->nSize;
    iVar4 = Gia_ObjCioId(pObj);
    iVar3 = Vec_IntEntry(pGVar2->vCis,(iVar3 - iVar5) + iVar4);
    pObj = Gia_ManObj(pGVar2,iVar3);
    f = f + 1;
    pRVar6 = Rnm_ManObj(p,pObj,f);
    if (((uint)*pRVar6 & 2) != 0) {
      return;
    }
  }
  iVar3 = Gia_ObjIsRo(pGVar2,pObj);
  if ((iVar3 == 0) &&
     (((int)(uint)*(undefined8 *)pObj < 0 ||
      (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)))) {
    __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                  ,500,
                  "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
  }
  iVar3 = 0;
  do {
    pGVar2 = p->pGia;
    iVar5 = Gia_ObjId(pGVar2,pObj);
    iVar5 = Vec_IntEntry(pGVar2->vFanoutNums,iVar5);
    if (iVar5 <= iVar3) {
      return;
    }
    pGVar2 = p->pGia;
    iVar5 = Gia_ObjId(pGVar2,pObj);
    p_00 = pGVar2->vFanout;
    iVar5 = Vec_IntEntry(p_00,iVar5);
    iVar5 = Vec_IntEntry(p_00,iVar5 + iVar3);
    pObj_00 = Gia_ManObj(pGVar2,iVar5);
    if ((pObj_00->Value != 0) && (pRVar6 = Rnm_ManObj(p,pObj_00,f), ((uint)*pRVar6 & 10) == 0)) {
      iVar5 = (int)*(ulong *)pObj_00;
      uVar8 = *(ulong *)pObj_00 & 0x1fffffff;
      if (-1 < iVar5 || uVar8 == 0x1fffffff) {
        if ((iVar5 < 0) || ((int)uVar8 == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pFanout)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                        ,0x202,
                        "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                       );
        }
        pRVar6 = Rnm_ManObj(p,pObj_00 + -uVar8,f);
        pRVar7 = Rnm_ManObj(p,pObj_00 + -(ulong)(*(uint *)&pObj_00->field_0x4 & 0x1fffffff),f);
        uVar10 = ((uint)(*(ulong *)pObj_00 >> 0x1d) & 7 ^ (uint)*pRVar6) & 1;
        uVar11 = (uint)*pRVar6 & 2;
        if ((uVar11 == 0) || (uVar10 != 0)) {
          RVar1 = *pRVar7;
          uVar9 = (uint)(*(ulong *)pObj_00 >> 0x3d) ^ (uint)RVar1;
          if (((((uint)RVar1 & 2) == 0) || ((uVar9 & 1) != 0)) &&
             (((uVar11 & (uint)RVar1) == 0 || ((uVar10 & uVar9) == 0)))) goto LAB_00492ea7;
        }
      }
      Rnm_ManJustifyPropFanout_rec(p,pObj_00,f,vSelect);
    }
LAB_00492ea7:
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Rnm_ManJustifyPropFanout_rec( Rnm_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect )
{
    Rnm_Obj_t * pRnm0, * pRnm1, * pRnm = Rnm_ManObj( p, pObj, f );
    Gia_Obj_t * pFanout = NULL;
    int i, k;//, Id = Gia_ObjId(p->pGia, pObj);
    assert( pRnm->fVisit == 0 );
    pRnm->fVisit = 1;
    if ( Rnm_ManObj( p, pObj, 0 )->fVisitJ == 0 )
    {
        Rnm_ManObj( p, pObj, 0 )->fVisitJ = 1;
        p->nVisited++;
    }
    if ( pRnm->fPPi )
    {
        assert( (int)pRnm->Prio > 0 );
        for ( i = p->pCex->iFrame; i >= 0; i-- )
            if ( !Rnm_ManObj(p, pObj, i)->fVisit )
                Rnm_ManJustifyPropFanout_rec( p, pObj, i, vSelect );
        Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    if ( (Gia_ObjIsCo(pObj) && f == p->pCex->iFrame) || Gia_ObjIsPo(p->pGia, pObj) )
        return;
    if ( Gia_ObjIsRi(p->pGia, pObj) )
    {
        pFanout = Gia_ObjRiToRo(p->pGia, pObj);
        if ( !Rnm_ManObj(p, pFanout, f+1)->fVisit )
            Rnm_ManJustifyPropFanout_rec( p, pFanout, f+1, vSelect );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStatic( p->pGia, pObj, pFanout, k )
    {
        Rnm_Obj_t * pRnmF;
        if ( pFanout->Value == 0 )
            continue;
        pRnmF = Rnm_ManObj(p, pFanout, f);
        if ( pRnmF->fPPi || pRnmF->fVisit )
            continue;
        if ( Gia_ObjIsCo(pFanout) )
        {
            Rnm_ManJustifyPropFanout_rec( p, pFanout, f, vSelect );
            continue;
        } 
        assert( Gia_ObjIsAnd(pFanout) );
        pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pFanout), f );
        pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pFanout), f );
        if ( ((pRnm0->Value ^ Gia_ObjFaninC0(pFanout)) == 0 && pRnm0->fVisit) ||
             ((pRnm1->Value ^ Gia_ObjFaninC1(pFanout)) == 0 && pRnm1->fVisit) || 
           ( ((pRnm0->Value ^ Gia_ObjFaninC0(pFanout)) == 1 && pRnm0->fVisit) && 
             ((pRnm1->Value ^ Gia_ObjFaninC1(pFanout)) == 1 && pRnm1->fVisit) ) )
           Rnm_ManJustifyPropFanout_rec( p, pFanout, f, vSelect );
    }
}